

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pRVar1;
  float fVar2;
  undefined8 uVar3;
  char *pcVar4;
  pointer pcVar5;
  size_type sVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  istream *piVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  const_iterator cVar14;
  size_t sVar15;
  ostream *poVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  int l;
  int iVar18;
  string *psVar19;
  pointer pfVar20;
  undefined8 in_R8;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  size_type sVar26;
  int j;
  long lVar27;
  int j_1;
  ulong uVar28;
  ulong uVar29;
  ulong uStackY_530;
  string *psVar30;
  undefined1 local_511;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_510;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> final_boxes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  final_words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  vector<float,_std::allocator<float>_> final_confs;
  vector<float,_std::allocator<float>_> confidences;
  vector<cv::Mat,_std::allocator<cv::Mat>_> channels;
  string output;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> nm_boxes;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  regions;
  Ptr<cv::text::OCRTesseract> ocr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  Ptr<cv::text::ERFilter> er_filter2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  Ptr<cv::text::ERFilter> er_filter1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_390;
  Mat group_img;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [5];
  vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
  nm_region_groups;
  Mat grey;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300 [5];
  Mat image;
  int local_2a8;
  int local_2a4;
  _Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> local_250;
  ifstream infile;
  undefined4 uStack_234;
  ulong local_228 [63];
  
  cv::Mat::Mat(&image);
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&grey,argv[1],(allocator<char> *)&group_img);
    cv::imread((string *)&infile,(int)&grey);
    cv::Mat::operator=(&image,(Mat *)&infile);
    cv::Mat::~Mat((Mat *)&infile);
    std::__cxx11::string::~string((string *)&grey);
    iVar10 = (int)in_R8;
    lex.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lex.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lex.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (argc != 2) {
      std::ifstream::ifstream(&infile,argv[2],_S_in);
      _grey = (pointer)local_300;
      local_300[0]._M_local_buf[0] = '\0';
      while( true ) {
        piVar11 = std::operator>>((istream *)&infile,(string *)&grey);
        iVar10 = (int)in_R8;
        if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&lex,(value_type *)&grey);
      }
      std::__cxx11::string::~string((string *)&grey);
      std::ifstream::~ifstream(&infile);
    }
    channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cv::Mat::Mat(&grey);
    local_228[0] = 0;
    local_378[0]._0_4_ = 0;
    local_378[0]._4_4_ = 0;
    _infile = (ulong *)CONCAT44(uStack_234,0x1010000);
    _group_img = 0x2010000;
    local_380._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&grey;
    cv::cvtColor((cv *)&infile,(_InputArray *)&group_img,(_OutputArray *)0x7,0,iVar10);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back(&channels,&grey);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&output,255.0);
    cv::operator-((Scalar_ *)&infile,(Mat *)&output);
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)&group_img);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>(&channels,&group_img);
    cv::Mat::~Mat(&group_img);
    cv::MatExpr::~MatExpr((MatExpr *)&infile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&infile,"trained_classifierNM1.xml",(allocator<char> *)&output);
    cv::text::loadClassifierNM1((string *)&group_img);
    cv::text::createERFilterNM1((Ptr *)&er_filter1,(int)&group_img,0.00015,0.13,0.2,true,0.1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_380);
    std::__cxx11::string::~string((string *)&infile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&infile,"trained_classifierNM2.xml",(allocator<char> *)&output);
    cv::text::loadClassifierNM2((string *)&group_img);
    cv::text::createERFilterNM2((Ptr *)&er_filter2,0.5);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_380);
    std::__cxx11::string::~string((string *)&infile);
    std::
    vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
    ::vector(&regions,((long)channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x60,(allocator_type *)&infile);
    lVar24 = 0;
    psVar30 = (string *)&infile;
    for (lVar27 = 0;
        lVar27 < (int)(((long)channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)channels.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x60); lVar27 = lVar27 + 1) {
      local_228[0] = 0;
      _infile = 0x1010000;
      (**(code **)(*_er_filter1 + 0x40))
                (_er_filter1,psVar30,
                 (long)&((regions.
                          super__Vector_base<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>).
                        _M_impl.super__Vector_impl_data._M_start + lVar24);
      local_228[0] = 0;
      _infile = (ulong *)CONCAT44(uStack_234,0x1010000);
      (**(code **)(*_er_filter2 + 0x40))
                (_er_filter2,psVar30,
                 (long)&((regions.
                          super__Vector_base<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>).
                        _M_impl.super__Vector_impl_data._M_start + lVar24);
      lVar24 = lVar24 + 0x18;
    }
    final_words.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    final_words.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    final_words.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    nm_region_groups.
    super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nm_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_378[0]._0_4_ = 0;
    local_378[0]._4_4_ = 0;
    nm_region_groups.
    super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nm_region_groups.
    super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    nm_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    nm_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _group_img = 0x1010000;
    output.field_2._M_allocated_capacity = 0;
    output._M_dataplus._M_p._0_4_ = 0x1050000;
    output._M_string_length = (size_type)&channels;
    _infile = local_228;
    local_228[0] = local_228[0] & 0xffffffffffffff00;
    local_380._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&image;
    cv::text::erGrouping
              ((_InputArray *)&group_img,(_InputArray *)&output,(vector *)&regions,
               (vector *)&nm_region_groups,(vector *)&nm_boxes,0,psVar30,0.5);
    std::__cxx11::string::~string((string *)&infile);
    cv::text::OCRTesseract::create((char *)&ocr,(char *)0x0,(char *)0x0,0,3);
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_allocated_capacity = output.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    lVar24 = 0;
    do {
      if ((int)((ulong)((long)nm_boxes.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)nm_boxes.
                             super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4) <= lVar24) {
        uVar29 = 0;
LAB_00106d9d:
        iVar10 = (int)uVar29;
        uVar25 = (ulong)iVar10;
        uVar29 = uVar29 + 1;
        do {
          if ((ulong)((long)final_words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)final_words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar25) {
            uVar29 = 0;
            goto LAB_00107073;
          }
          uVar28 = uVar29 & 0xffffffff;
          uStackY_530 = 0xffffffffffffffff;
          while( true ) {
            pRVar1 = final_boxes.
                     super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar25;
            uVar28 = (ulong)(int)uVar28;
            lVar24 = uVar28 * 4;
            lVar27 = uVar28 * -0x10;
            cVar14._M_current =
                 final_words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar28;
            while( true ) {
              iVar21 = (int)uStackY_530;
              if ((ulong)((long)final_words.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)final_words.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar28)
              goto LAB_00106fce;
              iVar21 = pRVar1->x;
              iVar23 = pRVar1->y;
              iVar22 = (&(final_boxes.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start)->x)[lVar24];
              iVar18 = (&(final_boxes.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start)->y)[lVar24];
              iVar7 = iVar22;
              if (iVar22 < iVar21) {
                iVar7 = iVar21;
              }
              iVar8 = iVar18;
              if (iVar18 < iVar23) {
                iVar8 = iVar23;
              }
              iVar21 = iVar21 + pRVar1->width;
              iVar22 = iVar22 + (&(final_boxes.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->width)[lVar24];
              if (iVar21 <= iVar22) {
                iVar22 = iVar21;
              }
              iVar23 = iVar23 + pRVar1->height;
              iVar18 = iVar18 + (&(final_boxes.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->height)[lVar24];
              if (iVar23 <= iVar18) {
                iVar18 = iVar23;
              }
              iVar21 = (iVar18 - iVar8) * (iVar22 - iVar7);
              if (iVar18 - iVar8 < 1) {
                iVar21 = 0;
              }
              if (iVar22 - iVar7 < 1) {
                iVar21 = 0;
              }
              iVar23 = pRVar1->height * pRVar1->width;
              iVar22 = (&(final_boxes.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start)->height)[lVar24] *
                       (&(final_boxes.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start)->width)[lVar24];
              local_510 = cVar14._M_current;
              if (((0.5 < (float)iVar21 / (float)((iVar22 + iVar23) - iVar21)) ||
                  ((double)iVar23 * 0.8 < (double)iVar21)) ||
                 ((double)iVar22 * 0.8 < (double)iVar21)) break;
              uVar28 = uVar28 + 1;
              lVar24 = lVar24 + 4;
              lVar27 = lVar27 + -0x10;
              uStackY_530 = 0xffffffffffffffff;
              cVar14._M_current = cVar14._M_current + 1;
            }
            if ((final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar25] <=
                 *(float *)((long)final_confs.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar24) &&
                 *(float *)((long)final_confs.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar24) !=
                 final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar25]) &&
               (iVar21 = iVar10, iVar10 != (int)uVar28)) break;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase(&final_words,cVar14);
            std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::erase
                      (&final_boxes,
                       (Rect_<int> *)
                       ((long)final_boxes.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start - lVar27));
            pfVar20 = (pointer)((long)final_confs.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar24 + 4);
            if (pfVar20 !=
                final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              memmove((void *)((long)final_confs.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar24),pfVar20,
                      (long)final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish +
                      (-lVar24 -
                      (long)final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start) + -4);
            }
            final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
            uStackY_530 = uVar28 & 0xffffffff;
          }
LAB_00106fce:
          if (iVar21 != iVar10) goto LAB_00106d9d;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&final_words,
                  final_words.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar25);
          std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::erase
                    (&final_boxes,
                     final_boxes.
                     super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar25);
          pfVar20 = final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar25 + 1;
          if (pfVar20 !=
              final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            memmove(final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar25,pfVar20,
                    (long)final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pfVar20);
          }
          final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               final_confs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
        } while( true );
      }
      cv::Mat::zeros((int)(MatExpr *)&infile,local_2a8 + 2,local_2a4 + 2);
      cv::MatExpr::operator_cast_to_Mat((MatExpr *)&group_img);
      cv::MatExpr::~MatExpr((MatExpr *)&infile);
      std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::vector
                ((vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> *)&local_250,
                 nm_region_groups.
                 super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar24);
      er_draw(&channels,&regions,
              (vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> *)&local_250,&group_img);
      std::_Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::~_Vector_base
                (&local_250);
      local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (lVar24 * 0x10);
      cv::Mat::Mat((Mat *)&infile,&group_img,
                   (Rect_ *)(nm_boxes.
                             super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar24));
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(words.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2010000);
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&group_img;
      cv::Mat::copyTo((_OutputArray *)&infile);
      cv::Mat::~Mat((Mat *)&infile);
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(words.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
      confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(confidences.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0x2010000);
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&group_img;
      confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&group_img;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&infile,0.0);
      uVar29 = (ulong)psVar30 & 0xffffffff00000000;
      cv::copyMakeBorder((_InputArray *)&words,(_OutputArray *)&confidences,0xf,0xf,0xf,0xf,0,
                         (Scalar_ *)&infile);
      local_228[0] = 0;
      _infile = (ulong *)0x0;
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      psVar30 = (string *)(uVar29 & 0xffffffff00000000);
      (**(code **)(*_ocr + 0x10))
                (_ocr,(pointer)&group_img,&output,(MatExpr *)&infile,(_InputArray *)&words,
                 (_OutputArray *)&confidences,psVar30);
      local_511 = 10;
      _Var12 = std::
               __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )output._M_dataplus._M_p,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )(output._M_dataplus._M_p + output._M_string_length),
                          (_Iter_equals_val<const_char>)&local_511);
      std::__cxx11::string::erase
                (&output,_Var12._M_current,output._M_dataplus._M_p + output._M_string_length);
      if (2 < output._M_string_length) {
        pbVar17 = local_510;
        for (lVar27 = 0; lVar27 < (int)((ulong)-(long)_infile >> 4); lVar27 = lVar27 + 1) {
          uVar3 = *(undefined8 *)
                   ((long)&(pbVar17->_M_dataplus)._M_p +
                   (long)&(nm_boxes.
                           super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_start)->x);
          _infile[lVar27 * 2] =
               CONCAT44((int)(_infile[lVar27 * 2] >> 0x20) + (int)((ulong)uVar3 >> 0x20) + -0xf,
                        (int)_infile[lVar27 * 2] + (int)uVar3 + -0xf);
          uVar29 = words.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar27]._M_string_length;
          if ((1 < uVar29) &&
             (fVar2 = confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar27], 51.0 <= fVar2)) {
            psVar19 = words.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar27;
            if (uVar29 == 2) {
              if ((60.0 <= fVar2) && (pcVar4 = (psVar19->_M_dataplus)._M_p, *pcVar4 != pcVar4[1])) {
LAB_00106cb3:
                bVar9 = isRepetitive(psVar19);
                pbVar17 = local_510;
                if (!bVar9) {
                  if (lex.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      lex.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    pcVar5 = (psVar19->_M_dataplus)._M_p;
                    for (uVar25 = 0; uVar29 != uVar25; uVar25 = uVar25 + 1) {
                      iVar10 = toupper((int)pcVar5[uVar25]);
                      pcVar5[uVar25] = (char)iVar10;
                    }
                    _Var13 = std::
                             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                       (lex.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        lex.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        words.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar27);
                    if (_Var13._M_current ==
                        lex.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar27] = 200.0;
                    }
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&final_words,
                              words.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar27);
                  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::push_back
                            (&final_boxes,(value_type *)(_infile + lVar27 * 2));
                  std::vector<float,_std::allocator<float>_>::push_back
                            (&final_confs,
                             confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar27);
                  pbVar17 = local_510;
                }
              }
            }
            else if ((3 < uVar29) || (60.0 <= fVar2)) goto LAB_00106cb3;
          }
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&confidences.super__Vector_base<float,_std::allocator<float>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&words);
      std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
                ((_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&infile);
      cv::Mat::~Mat(&group_img);
      lVar24 = lVar24 + 1;
    } while( true );
  }
  poVar16 = std::operator<<((ostream *)&std::cout,"    Usage: ");
  poVar16 = std::operator<<(poVar16,*argv);
  poVar16 = std::operator<<(poVar16," <input_image> [<input_txt_lexicon>]");
  std::endl<char,std::char_traits<char>>(poVar16);
LAB_00107377:
  cv::Mat::~Mat(&image);
  return 0;
LAB_00107073:
  if ((ulong)((long)final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar29) goto LAB_001072d7;
  if (lex.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      lex.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_00107178:
    poVar16 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cout,
                         final_boxes.
                         super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar29].x);
    poVar16 = std::operator<<(poVar16,",");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,final_boxes.
                                 super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar29].y);
    poVar16 = std::operator<<(poVar16,",");
    iVar21 = final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar29].width +
             final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar29].x;
    iVar10 = local_2a4 + -2;
    if (iVar21 <= local_2a4 + -2) {
      iVar10 = iVar21;
    }
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
    poVar16 = std::operator<<(poVar16,",");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,final_boxes.
                                 super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar29].y);
    poVar16 = std::operator<<(poVar16,",");
    iVar21 = final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar29].width +
             final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar29].x;
    iVar10 = local_2a4 + -2;
    if (iVar21 <= local_2a4 + -2) {
      iVar10 = iVar21;
    }
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
    poVar16 = std::operator<<(poVar16,",");
    iVar21 = final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar29].height +
             final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar29].y;
    iVar10 = local_2a8 + -2;
    if (iVar21 <= local_2a8 + -2) {
      iVar10 = iVar21;
    }
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
    poVar16 = std::operator<<(poVar16,",");
    poVar16 = (ostream *)
              std::ostream::operator<<
                        (poVar16,final_boxes.
                                 super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar29].x);
    poVar16 = std::operator<<(poVar16,",");
    iVar21 = final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar29].height +
             final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar29].y;
    iVar10 = local_2a8 + -2;
    if (iVar21 <= local_2a8 + -2) {
      iVar10 = iVar21;
    }
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
    poVar16 = std::operator<<(poVar16,",");
    poVar16 = std::operator<<(poVar16,(string *)
                                      (final_words.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar29));
    std::endl<char,std::char_traits<char>>(poVar16);
  }
  else {
    pcVar5 = final_words.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar29]._M_dataplus._M_p;
    sVar6 = final_words.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar29]._M_string_length;
    for (sVar26 = 0; sVar6 != sVar26; sVar26 = sVar26 + 1) {
      iVar10 = toupper((int)pcVar5[sVar26]);
      pcVar5[sVar26] = (char)iVar10;
    }
    _Var13 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (lex.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        lex.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        final_words.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar29);
    if (_Var13._M_current !=
        lex.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00107178;
    iVar10 = (int)final_words.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar29]._M_string_length;
    lVar24 = 0;
    for (uVar25 = 0;
        psVar19 = final_words.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar29,
        uVar25 < (ulong)((long)_Var13._M_current -
                         (long)lex.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar25 = uVar25 + 1)
    {
      sVar15 = edit_distance((string *)
                             ((long)&((lex.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar24),psVar19);
      iVar21 = (int)sVar15;
      if (iVar10 < (int)sVar15) {
        iVar21 = iVar10;
      }
      iVar10 = iVar21;
      lVar24 = lVar24 + 0x20;
      _Var13._M_current =
           lex.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((ulong)(long)iVar10 < psVar19->_M_string_length) {
      std::__cxx11::string::_M_assign((string *)psVar19);
      goto LAB_00107178;
    }
  }
  uVar29 = uVar29 + 1;
  goto LAB_00107073;
LAB_001072d7:
  std::__cxx11::string::~string((string *)&output);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b0);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            (&nm_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
  std::
  vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
  ::~vector(&nm_region_groups);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&final_confs.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            (&final_boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&final_words);
  std::
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  ::~vector(&regions);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_390);
  cv::Mat::~Mat(&grey);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&channels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lex);
  goto LAB_00107377;
}

Assistant:

int main(int argc, char* argv[])
{

    Mat image;
    if(argc>1)
    {
        image  = imread(argv[1]);
    }
    else
    {
        cout << "    Usage: " << argv[0] << " <input_image> [<input_txt_lexicon>]" << endl;
        return(0);
    }

    // Load lexicon if provided
    vector<string> lex;
    if(argc>2)
    {
        ifstream infile(argv[2]);
        string lex_word;
        while (infile >> lex_word)
        {
            lex.push_back(lex_word);
        }
    }

    /*Text Detection*/

    // Extract channels to be processed individually
    vector<Mat> channels;

    Mat grey;
    cvtColor(image,grey,COLOR_RGB2GRAY);


    // Extract channels to be processed individually
    // computeNMChannels(image, channels);
    // Notice here we are only using grey channel.
    channels.push_back(grey);
    channels.push_back(255-grey);

    // Create ERFilter objects with the 1st and 2nd stage default classifiers
    Ptr<ERFilter> er_filter1 = createERFilterNM1(loadClassifierNM1("trained_classifierNM1.xml"),8,0.00015f,0.13f,0.2f,true,0.1f);
    Ptr<ERFilter> er_filter2 = createERFilterNM2(loadClassifierNM2("trained_classifierNM2.xml"),0.5);

    vector<vector<ERStat> > regions(channels.size());
    // Apply the default cascade classifier to each independent channel
    for (int c=0; c<(int)channels.size(); c++)
    {
        er_filter1->run(channels[c], regions[c]);
        er_filter2->run(channels[c], regions[c]);
    }

    vector<string> final_words;
    vector<Rect>   final_boxes;
    vector<float>  final_confs;


    // Detect character groups
    vector< vector<Vec2i> > nm_region_groups;
    vector<Rect> nm_boxes;
    erGrouping(image, channels, regions, nm_region_groups, nm_boxes,ERGROUPING_ORIENTATION_HORIZ);



    /*Text Recognition (OCR)*/

    Ptr<OCRTesseract> ocr = OCRTesseract::create();
    string output;


    for (int i=0; i<(int)nm_boxes.size(); i++)
    {

        Mat group_img = Mat::zeros(image.rows+2, image.cols+2, CV_8UC1);
        er_draw(channels, regions, nm_region_groups[i], group_img);
        group_img(nm_boxes[i]).copyTo(group_img);
        copyMakeBorder(group_img,group_img,15,15,15,15,BORDER_CONSTANT,Scalar(0));

        vector<Rect>   boxes;
        vector<string> words;
        vector<float>  confidences;
        ocr->run(group_img, output, &boxes, &words, &confidences, OCR_LEVEL_WORD);

        output.erase(remove(output.begin(), output.end(), '\n'), output.end());
        //cout << "OCR output = \"" << output << "\" lenght = " << output.size() << endl;
        if (output.size() < 3)
            continue;

        for (int j=0; j<(int)boxes.size(); j++)
        {
            boxes[j].x += nm_boxes[i].x-15;
            boxes[j].y += nm_boxes[i].y-15;

            /* Filter words with low confidence, or less than 3 chars, or noisy recognitions */
            // Threshold values have been set using the ICDAR train set.
            //cout << "  word = " << words[j] << "\t confidence = " << confidences[j] << endl;
            if ((words[j].size() < 2) || (confidences[j] < 51) ||
                    ((words[j].size()==2) && (words[j][0] == words[j][1])) ||
                    ((words[j].size()< 4) && (confidences[j] < 60)) ||
                    isRepetitive(words[j]))
                continue;

            /* Increase confidence of predicted words matching a word in the lexicon */
            if (lex.size() > 0)
            {
                std::transform(words[j].begin(), words[j].end(), words[j].begin(), ::toupper);
                if (find(lex.begin(), lex.end(), words[j]) == lex.end())
                    confidences[j] = 200;
            }

            final_words.push_back(words[j]);
            final_boxes.push_back(boxes[j]);
            final_confs.push_back(confidences[j]);
        }

    }


    /* Non Maximal Suppression using OCR confidence */
    float thr = 0.5;

    for (int i=0; i<final_words.size(); )
    {
        int to_delete = -1;
        for (int j=i+1; j<final_words.size(); )
        {
            to_delete = -1;
            Rect intersection = final_boxes[i] & final_boxes[j];
            float IoU = (float)intersection.area() / (final_boxes[i].area() + final_boxes[j].area() - intersection.area());
            if ((IoU > thr) || (intersection.area() > 0.8*final_boxes[i].area()) || (intersection.area() > 0.8*final_boxes[j].area()))
            {
                // if regions overlap more than thr delete the one with lower confidence
                to_delete = (final_confs[i] < final_confs[j]) ? i : j;

                if (to_delete == j )
                {
                    final_words.erase(final_words.begin()+j);
                    final_boxes.erase(final_boxes.begin()+j);
                    final_confs.erase(final_confs.begin()+j);
                    continue;
                } else {
                    break;
                }
            }
            j++;
        }
        if (to_delete == i )
        {
            final_words.erase(final_words.begin()+i);
            final_boxes.erase(final_boxes.begin()+i);
            final_confs.erase(final_confs.begin()+i);
            continue;
        }
        i++;
    }

    /* Predicted words which are not in the lexicon are filtered
       or changed to match one (when edit distance ratio < 0.34)*/
    float max_edit_distance_ratio = 0.34;
    for (int j=0; j<final_boxes.size(); j++)
    {

        if (lex.size() > 0)
        {
            std::transform(final_words[j].begin(), final_words[j].end(), final_words[j].begin(), ::toupper);
            if (find(lex.begin(), lex.end(), final_words[j]) == lex.end())
            {
                int best_match = -1;
                int best_dist  = final_words[j].size();
                for (int l=0; l<lex.size(); l++)
                {
                    int dist = edit_distance(lex[l],final_words[j]);
                    if (dist < best_dist)
                    {
                        best_match = l;
                        best_dist = dist;
                    }
                }
                if (best_dist/final_words[j].size() < max_edit_distance_ratio)
                    final_words[j] = lex[best_match];
                else
                    continue;
            }
        }

        // Output final recognition in csv format compatible with the ICDAR Robust Reading Competition
        cout << final_boxes[j].tl().x << ","
             << final_boxes[j].tl().y << ","
             << min(final_boxes[j].br().x,image.cols-2)
             << "," << final_boxes[j].tl().y << ","
             << min(final_boxes[j].br().x,image.cols-2) << ","
             << min(final_boxes[j].br().y,image.rows-2) << ","
             << final_boxes[j].tl().x << ","
             << min(final_boxes[j].br().y,image.rows-2) << ","
             << final_words[j] << endl ;
    }

    return 0;
}